

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O2

void __thiscall
tf::
Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:751:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:763:40)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:774:38)>_>
::_on_pipe(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
           *this,Pipeflow *pf,Runtime *rt)

{
  size_t sVar1;
  atomic<unsigned_long> *paVar2;
  pthread_mutex_t *__mutex;
  pointer paVar3;
  size_t *psVar4;
  code *pcVar5;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  Enum EVar6;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  Result local_e0;
  ResultBuilder DOCTEST_RB;
  Expression_lhs<const_unsigned_long_&> local_48;
  size_t local_38;
  
  sVar1 = pf->_pipe;
  EVar6 = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_at = EVar6;
  local_48.m_at = EVar6;
  if (sVar1 == 2) {
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x307;
    DOCTEST_RB.super_AssertData.m_expr = "j3 < N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_48.lhs = *(size_t **)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                            ._M_head_impl._callable + 0x10);
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_e0,&local_48,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                .
                super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                .
                super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                .
                super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                ._M_head_impl._callable.N);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e0);
    doctest::String::~String(&local_e0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_01);
    if (extraout_AL_01 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x308;
    DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_48.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                            .
                            super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                            ._M_head_impl._callable + 0x20));
    local_38 = pf->_line;
    DOCTEST_RB.super_AssertData.m_at = EVar6;
    local_48.m_at = EVar6;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_48,&local_38);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e0);
    doctest::String::~String(&local_e0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_02);
    if (extraout_AL_02 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x309;
    DOCTEST_RB.super_AssertData.m_expr = "source[j3] + 2 == mybuffer[pf.line()][pf.pipe() - 1]";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_48.lhs = (unsigned_long *)
                   ((ulong)(((*(vector<int,_std::allocator<int>_> **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                                       ._M_head_impl._callable + 8))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [**(size_t **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                                       .
                                       super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                                       ._M_head_impl._callable + 0x10)] + 2) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_e0,(Expression_lhs<const_int> *)&local_48,
               ((*(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> **)
                  ((long)&(this->_pipes).
                          super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                          .
                          super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                          .
                          super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                          .
                          super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                          ._M_head_impl._callable + 0x18))->
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start[pf->_line]._M_elems + (pf->_pipe - 1));
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e0);
    doctest::String::~String(&local_e0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_03);
    if (extraout_AL_03 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    psVar4 = *(size_t **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                      .
                      super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                      .
                      super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                      .
                      super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>,_false>
                      ._M_head_impl._callable + 0x10);
    *psVar4 = *psVar4 + 1;
  }
  else if (sVar1 == 1) {
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x2fc;
    DOCTEST_RB.super_AssertData.m_expr = "j2++ < N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    paVar2 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
             .
             super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
             .
             super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
             ._M_head_impl._callable.j2;
    LOCK();
    local_48.lhs = (unsigned_long *)(paVar2->super___atomic_base<unsigned_long>)._M_i;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    doctest::detail::Expression_lhs<const_unsigned_long>::operator<<unsigned_long,_nullptr>
              (&local_e0,(Expression_lhs<const_unsigned_long> *)&local_48,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                .
                super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                .
                super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
                ._M_head_impl._callable.N);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e0);
    doctest::String::~String(&local_e0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
    if (extraout_AL != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    __mutex = (pthread_mutex_t *)
              (this->_pipes).
              super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
              .
              super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
              .
              super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
              ._M_head_impl._callable.mutex;
    std::mutex::lock((mutex *)&__mutex->__data);
    local_38 = pf->_line;
    paVar3 = (((this->_pipes).
               super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
               .
               super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
               .
               super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
               ._M_head_impl._callable.mybuffer)->
             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar3[local_38]._M_elems[pf->_pipe] = paVar3[local_38]._M_elems[pf->_pipe - 1] + 1;
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x301;
    DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_48.lhs = (unsigned_long *)
                   (pf->_token %
                   (this->_pipes).
                   super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                   .
                   super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                   .
                   super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
                   ._M_head_impl._callable.L);
    DOCTEST_RB.super_AssertData.m_at = EVar6;
    local_48.m_at = EVar6;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_48,&local_38);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e0);
    doctest::String::~String(&local_e0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_00);
    if (extraout_AL_00 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    std::vector<int,_std::allocator<int>_>::push_back
              ((this->_pipes).
               super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
               .
               super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
               .
               super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
               ._M_head_impl._callable.collection,
               (((this->_pipes).
                 super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                 .
                 super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                 .
                 super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_false>
                 ._M_head_impl._callable.mybuffer)->
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start[pf->_line]._M_elems + (pf->_pipe - 1));
    pthread_mutex_unlock(__mutex);
  }
  else if (sVar1 == 0) {
    local_48.lhs = (this->_pipes).
                   super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                   .
                   super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
                   ._M_head_impl._callable.j1;
    if (*local_48.lhs ==
        (this->_pipes).
        super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
        .
        super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
        ._M_head_impl._callable.N) {
      Pipeflow::stop(pf);
      return;
    }
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x2f4;
    DOCTEST_RB.super_AssertData.m_expr = "j1 == source[j1]";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<int,_nullptr>
              (&local_e0,&local_48,
               (((this->_pipes).
                 super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                 .
                 super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
                 ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>).
               _M_impl.super__Vector_impl_data._M_start + *local_48.lhs);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e0);
    doctest::String::~String(&local_e0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_04);
    if (extraout_AL_04 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x2f5;
    DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_48.lhs = (unsigned_long *)
                   (pf->_token %
                   (this->_pipes).
                   super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
                   .
                   super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
                   ._M_head_impl._callable.L);
    local_38 = pf->_line;
    DOCTEST_RB.super_AssertData.m_at = EVar6;
    local_48.m_at = EVar6;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_48,&local_38);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e0);
    doctest::String::~String(&local_e0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_05);
    if (extraout_AL_05 != '\0') {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    psVar4 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
             .
             super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
             ._M_head_impl._callable.j1;
    sVar1 = *psVar4;
    (((this->_pipes).
      super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
      .
      super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
      ._M_head_impl._callable.mybuffer)->
    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
    super__Vector_impl_data._M_start[pf->_line]._M_elems[pf->_pipe] =
         (((this->_pipes).
           super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:763:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:774:38)>_>
           .
           super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:751:38)>,_false>
           ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_start[sVar1] + 1;
    *psVar4 = sVar1 + 1;
  }
  return;
}

Assistant:

void Pipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime& rt) {
  visit_tuple([&](auto&& pipe){
    using callable_t = typename std::decay_t<decltype(pipe)>::callable_t;
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      pipe._callable(pf);
    }
    else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
      pipe._callable(pf, rt);
    }
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}